

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O3

Id __thiscall QAccessibleCache::idForObject(QAccessibleCache *this,QObject *obj)

{
  bool bVar1;
  QMetaObject *pQVar2;
  iterator iVar3;
  iterator iVar4;
  Id IVar5;
  long in_FS_OFFSET;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> local_48;
  QObject *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = obj;
  if (obj != (QObject *)0x0) {
    pQVar2 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj);
    QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::valuesImpl<QObject*>
              (&local_48,
               (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)(this + 0x20),
               &local_30);
    iVar3 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin(&local_48);
    iVar4 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end(&local_48);
    bVar1 = true;
    for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
      if ((iVar3.i)->second == pQVar2) {
        pQVar2 = (QMetaObject *)(ulong)(iVar3.i)->first;
        bVar1 = false;
        break;
      }
    }
    IVar5 = (Id)pQVar2;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    if (!bVar1) goto LAB_005875d5;
  }
  IVar5 = 0;
LAB_005875d5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return IVar5;
}

Assistant:

QAccessible::Id QAccessibleCache::idForObject(QObject *obj) const
{
    if (obj) {
        const QMetaObject *mo = obj->metaObject();
        for (auto pair : objectToId.values(obj)) {
            if (pair.second == mo) {
                return pair.first;
            }
        }
    }
    return 0;
}